

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

FieldSubset * __thiscall
capnp::StructSchema::getUnionFields(FieldSubset *__return_storage_ptr__,StructSchema *this)

{
  RawBrandedSchema *pRVar1;
  uint16_t *puVar2;
  void *pvVar3;
  int iVar4;
  CapTableReader *pCVar5;
  SegmentReader *pSVar6;
  uint uVar7;
  StructReader local_b8;
  ListReader local_88;
  PointerReader local_58;
  
  local_58.pointer = (WirePointer *)((this->super_Schema).raw)->generic->encodedNode;
  local_58.segment = (SegmentReader *)0x0;
  local_58.capTable = (CapTableReader *)0x0;
  local_58.nestingLimit = 0x7fffffff;
  uVar7 = 0;
  _::PointerReader::getStruct(&local_b8,&local_58,(word *)0x0);
  pvVar3 = local_b8.data;
  local_b8.data = (void *)0x0;
  pCVar5 = (CapTableReader *)0x0;
  pSVar6 = (SegmentReader *)0x0;
  iVar4 = 0x7fffffff;
  if (3 < local_b8.pointerCount) {
    local_b8.data = (void *)(CONCAT44(local_b8.pointers._4_4_,(int)local_b8.pointers) + 0x18);
    pCVar5 = local_b8.capTable;
    pSVar6 = local_b8.segment;
    iVar4 = local_b8.nestingLimit;
  }
  pRVar1 = (this->super_Schema).raw;
  local_b8.segment = pSVar6;
  local_b8.capTable = pCVar5;
  local_b8.pointers._0_4_ = iVar4;
  _::PointerReader::getList(&local_88,(PointerReader *)&local_b8,INLINE_COMPOSITE,(word *)0x0);
  puVar2 = ((this->super_Schema).raw)->generic->membersByDiscriminant;
  if (0xff < local_b8.dataSize) {
    uVar7 = (uint)*(ushort *)((long)pvVar3 + 0x1e);
  }
  (__return_storage_ptr__->list).reader.structDataSize = local_88.structDataSize;
  (__return_storage_ptr__->list).reader.structPointerCount = local_88.structPointerCount;
  (__return_storage_ptr__->list).reader.elementSize = local_88.elementSize;
  (__return_storage_ptr__->list).reader.field_0x27 = local_88._39_1_;
  (__return_storage_ptr__->list).reader.nestingLimit = local_88.nestingLimit;
  *(undefined4 *)&(__return_storage_ptr__->list).reader.field_0x2c = local_88._44_4_;
  (__return_storage_ptr__->list).reader.ptr = local_88.ptr;
  (__return_storage_ptr__->list).reader.elementCount = local_88.elementCount;
  (__return_storage_ptr__->list).reader.step = local_88.step;
  (__return_storage_ptr__->list).reader.segment = local_88.segment;
  (__return_storage_ptr__->list).reader.capTable = local_88.capTable;
  (__return_storage_ptr__->parent).super_Schema.raw = pRVar1;
  __return_storage_ptr__->indices = puVar2;
  __return_storage_ptr__->size_ = uVar7;
  return __return_storage_ptr__;
}

Assistant:

StructSchema::FieldSubset StructSchema::getUnionFields() const {
  auto proto = getProto().getStruct();
  return FieldSubset(*this, proto.getFields(),
                     raw->generic->membersByDiscriminant, proto.getDiscriminantCount());
}